

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O3

void test_cio_write_buffer_split_and_append_empty_list(void)

{
  cio_write_buffer wb2;
  cio_write_buffer wbh_to_split;
  undefined8 **local_90;
  undefined8 **local_88;
  char *local_80;
  undefined8 local_78;
  undefined8 **local_70;
  undefined8 **local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 **local_50;
  undefined8 **local_48;
  UNITY_INT local_40;
  UNITY_INT local_38;
  undefined8 **local_30;
  undefined8 **local_28;
  undefined8 local_20;
  UNITY_INT UStack_18;
  
  local_30 = &local_30;
  local_20 = 0;
  UStack_18 = 0;
  local_88 = &local_70;
  local_60 = "HELLO";
  local_58 = 6;
  local_90 = &local_50;
  local_70 = &local_90;
  local_80 = "World";
  local_78 = 6;
  local_40 = 2;
  local_38 = 0xc;
  local_68 = local_90;
  local_50 = local_88;
  local_48 = local_70;
  local_28 = local_30;
  UnityAssertEqualNumber
            (0,0,"Number of elements in splitted list not correct!",0x17b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,UStack_18,"Total size of splitted list not correct!",0x17c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,local_40,"Number of elements in appended list not correct!",0x17d,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0xc,local_38,"Total size of appended list not correct!",0x17e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_split_and_append_empty_list(void)
{
	struct cio_write_buffer wbh_to_split;
	cio_write_buffer_head_init(&wbh_to_split);

	struct cio_write_buffer wbh_to_append;
	cio_write_buffer_head_init(&wbh_to_append);

	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, "HELLO", sizeof("HELLO"));
	cio_write_buffer_queue_tail(&wbh_to_append, &wb1);
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, "World", sizeof("World"));
	cio_write_buffer_queue_tail(&wbh_to_append, &wb2);
	size_t size_before_append = cio_write_buffer_get_total_size(&wbh_to_append);

	struct cio_write_buffer *e = &wbh_to_split;

	cio_write_buffer_split_and_append(&wbh_to_append, &wbh_to_split, e);
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_num_buffer_elements(&wbh_to_split), "Number of elements in splitted list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh_to_split), "Total size of splitted list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(2, cio_write_buffer_get_num_buffer_elements(&wbh_to_append), "Number of elements in appended list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(size_before_append, cio_write_buffer_get_total_size(&wbh_to_append), "Total size of appended list not correct!");
}